

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O2

void __thiscall OpenMD::FluctuatingChargeNVE::PositionStep(FluctuatingChargeNVE *this,RealType dt)

{
  pointer ppAVar1;
  DataStoragePointer DVar2;
  Snapshot *pSVar3;
  long lVar4;
  Molecule *pMVar5;
  pointer ppAVar6;
  long lVar7;
  Atom *pAVar8;
  MoleculeIterator i;
  MoleculeIterator local_18;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_18._M_node = (_Base_ptr)0x0;
    pMVar5 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
LAB_001d55b9:
    if (pMVar5 != (Molecule *)0x0) {
      ppAVar6 = (pMVar5->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar1 = (pMVar5->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar6 == ppAVar1) {
        pAVar8 = (Atom *)0x0;
        goto LAB_001d55e5;
      }
      do {
        pAVar8 = *ppAVar6;
LAB_001d55e5:
        do {
          if (pAVar8 == (Atom *)0x0) {
            pMVar5 = SimInfo::nextMolecule
                               ((this->super_FluctuatingChargePropagator).info_,&local_18);
            goto LAB_001d55b9;
          }
          DVar2 = (pAVar8->super_StuntDouble).storage_;
          pSVar3 = ((pAVar8->super_StuntDouble).snapshotMan_)->currentSnapshot_;
          lVar7 = (long)(pAVar8->super_StuntDouble).localIndex_;
          lVar4 = *(long *)((long)&(pSVar3->atomData).flucQPos.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + DVar2);
          *(double *)(lVar4 + lVar7 * 8) =
               *(double *)
                (*(long *)((long)&(pSVar3->atomData).flucQVel.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + DVar2) + lVar7 * 8) * dt +
               *(double *)(lVar4 + lVar7 * 8);
          ppAVar6 = ppAVar6 + 1;
          pAVar8 = (Atom *)0x0;
        } while (ppAVar6 == ppAVar1);
      } while( true );
    }
  }
  return;
}

Assistant:

void FluctuatingChargeNVE::PositionStep(RealType dt) {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cpos;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel = atom->getFlucQVel();
        cpos = atom->getFlucQPos();

        cpos += dt * cvel;
        atom->setFlucQPos(cpos);
      }
    }
  }